

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall
kj::Path::evalWin32Impl
          (Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path,
          bool fromApi)

{
  byte bVar1;
  String *pSVar2;
  char *c;
  void *pvVar3;
  Fault FVar4;
  long lVar5;
  String *pSVar6;
  Exception *pEVar7;
  Exception *extraout_RDX;
  char (*params) [3];
  char *__file;
  size_t newSize;
  ArrayDisposer *pAVar9;
  size_t sVar10;
  Exception *pEVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  bool bVar14;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  StringPtr local_98;
  DebugExpression<bool> _kjCondition;
  Exception *local_80;
  Exception *local_78;
  Fault f;
  size_t local_68;
  Exception *local_60;
  String ownPath;
  undefined7 uVar8;
  
  pEVar11 = (Exception *)path.content.ptr;
  puVar13 = (undefined1 *)((long)&pEVar11[-1].details.builder.disposer + 7);
  pEVar7 = pEVar11;
  local_98.content.ptr = (char *)parts;
  local_98.content.size_ = (size_t)pEVar11;
  if ((int)path.content.size_ == 0) {
    pvVar3 = memchr(parts,0x2f,(size_t)puVar13);
    FVar4.exception = extraout_RDX;
    if (pvVar3 == (void *)0x0) {
LAB_004bf2e2:
      local_80 = (Exception *)0x0;
      local_78 = (Exception *)0x0;
      sVar10 = 0;
    }
    else {
      heapString((String *)&f,(char *)parts,(size_t)puVar13);
      local_80 = local_60;
      FVar4 = f;
      if (local_68 == 0) {
        FVar4.exception = (Exception *)0x0;
      }
      pEVar7 = (Exception *)
               ((undefined1 *)((long)&f.exception[-1].details.builder.disposer + 7) + local_68);
      if (local_68 == 0) {
        pEVar7 = (Exception *)0x0;
      }
      for (; FVar4.exception != pEVar7;
          FVar4.exception = (Exception *)((long)&((FVar4.exception)->ownFile).content.ptr + 1)) {
        if (*(char *)&((FVar4.exception)->ownFile).content.ptr == '/') {
          *(undefined1 *)&((FVar4.exception)->ownFile).content.ptr = 0x5c;
        }
      }
      local_78 = f.exception;
      parts = (Vector<kj::String> *)(Exception *)0x524569;
      if (local_68 != 0) {
        parts = (Vector<kj::String> *)f;
      }
      pEVar11 = (Exception *)(local_68 + (local_68 == 0));
      puVar13 = (undefined1 *)((long)&pEVar11[-1].details.builder.disposer + 7);
      FVar4 = f;
      sVar10 = local_68;
      local_98.content.ptr = (char *)parts;
      local_98.content.size_ = (size_t)pEVar11;
    }
    if ((undefined1 *)0x1 < puVar13) goto LAB_004bf339;
    bVar14 = puVar13 != (undefined1 *)0x0;
    puVar13 = (undefined1 *)0x1;
    if (bVar14) goto LAB_004bf345;
    goto LAB_004bf522;
  }
  FVar4.exception = (Exception *)parts;
  if (puVar13 < &DAT_00000004) goto LAB_004bf2e2;
  local_78 = (Exception *)0x0;
  if (*(int *)&(parts->builder).ptr == 0x5c3f5c5c) {
    local_98.content.ptr = (char *)((long)&(parts->builder).ptr + 4);
    local_98.content.size_ = (long)&pEVar11[-1].details.builder.disposer + 4;
    local_60 = (Exception *)((long)&pEVar11[-1].details.builder.disposer + 3);
    if (((Exception *)0x3 < local_60) &&
       (*(int *)&((ArrayBuilder<kj::String> *)&((Exception *)local_98.content.ptr)->ownFile)->ptr ==
        0x5c434e55)) {
      local_98.content.ptr = (char *)&(parts->builder).pos;
      local_98.content.size_ = (size_t)&pEVar11[-1].details.builder.disposer;
    }
    ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
    local_80 = (Exception *)0x0;
    sVar10 = 0;
    local_78 = (Exception *)0x0;
    goto LAB_004bf53b;
  }
  sVar10 = 0;
  local_80 = (Exception *)0x0;
LAB_004bf339:
  if (*(short *)&((ArrayBuilder<kj::String> *)&((Exception *)parts)->ownFile)->ptr == 0x5c5c) {
    local_98.content.ptr =
         (char *)((long)&((ArrayBuilder<kj::String> *)&((Exception *)parts)->ownFile)->ptr + 2);
    local_98.content.size_ = (long)&pEVar11[-1].details.builder.disposer + 6;
    local_60 = pEVar7;
    goto LAB_004bf3ee;
  }
LAB_004bf345:
  if (*(char *)&((ArrayBuilder<kj::String> *)&((Exception *)parts)->ownFile)->ptr == '\\') {
    _kjCondition.value = (bool)((byte)path.content.size_ ^ 1);
    if (_kjCondition.value == false) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x17b,FAILED,"!fromApi","_kjCondition,\"parseWin32Api() requires absolute path\"",
                 &_kjCondition,(char (*) [39])"parseWin32Api() requires absolute path");
      kj::_::Debug::Fault::fatal(&f);
    }
    pEVar7 = (Exception *)(this->parts).ptr;
    lVar5 = (this->parts).size_ - (long)pEVar7;
    if (lVar5 == 0) {
LAB_004bf3fb:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x186,FAILED,(char *)0x0,"\"must specify drive letter\", path",
                 (char (*) [26])"must specify drive letter",&local_98);
      ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
      str<char_const(&)[3]>((String *)&f,(kj *)"c:",params);
      pSVar6 = (String *)(this->parts).size_;
      if (pSVar6 == (String *)(this->parts).disposer) {
        pSVar2 = (this->parts).ptr;
        newSize = 4;
        if (pSVar6 != pSVar2) {
          newSize = ((long)pSVar6 - (long)pSVar2 >> 3) * 0x5555555555555556;
        }
        Vector<kj::String>::setCapacity((Vector<kj::String> *)this,newSize);
        pSVar6 = (String *)(this->parts).size_;
      }
      (pSVar6->content).ptr = (char *)f.exception;
      (pSVar6->content).size_ = local_68;
      (pSVar6->content).disposer = (ArrayDisposer *)local_60;
      (this->parts).size_ = (size_t)(pSVar6 + 1);
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
    }
    else {
      if (((pEVar7->ownFile).content.size_ == 3) &&
         (pEVar7 = (Exception *)(pEVar7->ownFile).content.ptr,
         *(char *)((long)&(pEVar7->ownFile).content.ptr + 1) == ':')) {
        bVar1 = *(byte *)&(pEVar7->ownFile).content.ptr;
        uVar8 = (undefined7)((ulong)pEVar7 >> 8);
        pEVar7 = (Exception *)CONCAT71(uVar8,bVar1);
        if ((char)bVar1 < 'a') {
          pEVar7 = (Exception *)CONCAT71(uVar8,bVar1 + 0xbf);
          if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_004bf398;
        }
        else if (0x7a < bVar1) goto LAB_004bf398;
        __file = (char *)0x1;
      }
      else {
LAB_004bf398:
        if ((ulong)((lVar5 >> 3) * -0x5555555555555555) < 2) goto LAB_004bf3fb;
        __file = (char *)0x2;
      }
      ArrayBuilder<kj::String>::truncate
                ((ArrayBuilder<kj::String> *)this,__file,(__off_t)FVar4.exception);
      local_60 = pEVar7;
    }
    goto LAB_004bf53b;
  }
  if (((puVar13 == (undefined1 *)0x2) ||
      (((undefined1 *)0x2 < puVar13 &&
       (*(char *)((long)&((ArrayBuilder<kj::String> *)&((Exception *)parts)->ownFile)->ptr + 2) ==
        '\\')))) &&
     (*(char *)((long)&((ArrayBuilder<kj::String> *)&((Exception *)parts)->ownFile)->ptr + 1) == ':'
     )) {
    bVar1 = *(byte *)&((ArrayBuilder<kj::String> *)&((Exception *)parts)->ownFile)->ptr;
    local_60 = pEVar7;
    if ((char)bVar1 < 'a') {
      if ((byte)(bVar1 + 0xbf) < 0x1a) goto LAB_004bf3ee;
    }
    else if (bVar1 < 0x7b) {
LAB_004bf3ee:
      ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
      goto LAB_004bf53b;
    }
  }
LAB_004bf522:
  local_60 = pEVar7;
  _kjCondition.value = (bool)((byte)path.content.size_ ^ 1);
  if (_kjCondition.value == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x192,FAILED,"!fromApi","_kjCondition,\"parseWin32Api() requires absolute path\"",
               &_kjCondition,(char (*) [39])"parseWin32Api() requires absolute path");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_004bf53b:
  puVar13 = (undefined1 *)0x0;
  pEVar7 = (Exception *)(local_98.content.size_ + -400);
  if ((Exception *)local_98.content.size_ == (Exception *)0x1) {
    pEVar11 = (Exception *)0x1;
  }
  else {
    puVar12 = (undefined1 *)0x0;
    do {
      if (puVar12[(long)((void **)((long)local_98.content.ptr + 0x68) + -0xd)] == '\\') {
        part.size_ = (size_t)local_60;
        part.ptr = puVar12 + -(long)puVar13;
        evalPart(this,(Vector<kj::String> *)
                      (puVar13 + (long)((void **)((long)local_98.content.ptr + 0x68) + -0xd)),part);
        puVar13 = puVar12 + 1;
      }
      puVar12 = puVar12 + 1;
      pEVar11 = (Exception *)local_98.content.size_;
    } while (puVar12 != (undefined1 *)((long)&(pEVar7->details).builder.disposer + 7));
  }
  part_00.ptr = (char *)((long)pEVar11->trace + (~(ulong)puVar13 - 0x68));
  part_00.size_ = (size_t)local_60;
  evalPart(this,(Vector<kj::String> *)
                (puVar13 + (long)((void **)((long)local_98.content.ptr + 0x68) + -0xd)),part_00);
  pAVar9 = (ArrayDisposer *)(this->parts).size_;
  if (pAVar9 != (this->parts).disposer) {
    Vector<kj::String>::setCapacity
              ((Vector<kj::String> *)this,
               ((long)pAVar9 - (long)(this->parts).ptr >> 3) * -0x5555555555555555);
    pAVar9 = (ArrayDisposer *)(this->parts).size_;
  }
  pSVar6 = (this->parts).ptr;
  pSVar2 = this[1].parts.ptr;
  (this->parts).ptr = (String *)0x0;
  (this->parts).size_ = 0;
  (this->parts).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar6;
  (__return_storage_ptr__->parts).size_ = ((long)pAVar9 - (long)pSVar6 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)pSVar2;
  if (local_78 != (Exception *)0x0) {
    (**(code **)(local_80->ownFile).content.ptr)(local_80,local_78,1,sVar10,sVar10,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalWin32Impl(Vector<String>&& parts, StringPtr path, bool fromApi) {
  // Convert all forward slashes to backslashes.
  String ownPath;
  if (!fromApi && path.findFirst('/') != kj::none) {
    ownPath = heapString(path);
    for (char& c: ownPath) {
      if (c == '/') c = '\\';
    }
    path = ownPath;
  }

  // Interpret various forms of absolute paths.
  if (fromApi && path.startsWith("\\\\?\\")) {
    path = path.slice(4);
    if (path.startsWith("UNC\\")) {
      path = path.slice(4);
    }

    // The path is absolute.
    parts.clear();
  } else if (path.startsWith("\\\\")) {
    // UNC path.
    path = path.slice(2);

    // This path is absolute. The first component is a server name.
    parts.clear();
  } else if (path.startsWith("\\")) {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");

    // Path is relative to the current drive / network share.
    if (parts.size() >= 1 && isWin32Drive(parts[0])) {
      // Leading \ interpreted as root of current drive.
      parts.truncate(1);
    } else if (parts.size() >= 2) {
      // Leading \ interpreted as root of current network share (which is indicated by the first
      // *two* components of the path).
      parts.truncate(2);
    } else {
      KJ_FAIL_REQUIRE("must specify drive letter", path) {
        // Recover by assuming C drive.
        parts.clear();
        parts.add(kj::str("c:"));
        break;
      }
    }
  } else if ((path.size() == 2 || (path.size() > 2 && path[2] == '\\')) &&
             isWin32Drive(path.first(2))) {
    // Starts with a drive letter.
    parts.clear();
  } else {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '\\') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}